

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void Popup_Error(Am_Value_List *strings)

{
  ulong uVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_58;
  Am_Value local_50;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Value_List *local_10;
  Am_Value_List *strings_local;
  
  local_10 = strings;
  uVar1 = Am_Object::Valid();
  if ((uVar1 & 1) == 0) {
    Am_Object::Create((char *)&local_18);
    pAVar2 = (Am_Object *)Am_Object::Set((ushort)&local_18,true,0);
    Am_Object::operator=(&error_dialog,pAVar2);
    Am_Object::~Am_Object(&local_18);
    Am_Object::Am_Object(local_30,(Am_Object *)&error_dialog);
    Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(local_30,0),1);
    Am_Object::~Am_Object(local_30);
  }
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(strings);
  Am_Object::Set(0x55f8,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(&local_38,(Am_Object *)&error_dialog);
  Am_Object::Am_Object(&local_40,(Am_Object *)&window);
  Show_Dialog_Centered(&local_38,&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_58,(Am_Object *)&error_dialog);
  Am_Show_Dialog_And_Wait((Am_Object *)&local_50,SUB81(&local_58,0));
  Am_Value::~Am_Value(&local_50);
  Am_Object::~Am_Object(&local_58);
  return;
}

Assistant:

void
Popup_Error(Am_Value_List strings)
{
  if (!error_dialog.Valid()) {
    error_dialog =
        Am_Alert_Dialog.Create("error_dialog").Set(Am_VISIBLE, false);
    Am_Screen.Add_Part(error_dialog);
  }

  // add new message to error dialog
  error_dialog.Set(Am_ITEMS, strings);

  // show it
  Show_Dialog_Centered(error_dialog, window);
  Am_Show_Dialog_And_Wait(error_dialog);
}